

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  Mem *pMem;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *__s1;
  char *__s2;
  ulong val;
  uint uVar8;
  
  uVar2 = (*argv)->flags;
  uVar3 = argv[1]->flags;
  if ((((uint)(0xaaaaaaaaL >> ((byte)uVar3 & 0x1f)) | (uint)(0xaaaaaaaaL >> ((byte)uVar2 & 0x1f))) &
      1) == 0) {
    iVar5 = sqlite3ValueBytes(*argv,'\x01');
    uVar6 = sqlite3ValueBytes(argv[1],'\x01');
    if ((int)uVar6 < 1) {
      val = 1;
    }
    else {
      if (((uVar3 | uVar2) & 0xf) == 0) {
        __s1 = (char *)sqlite3_value_blob(*argv);
        __s2 = (char *)sqlite3_value_blob(argv[1]);
      }
      else {
        __s1 = (char *)sqlite3ValueText(*argv,'\x01');
        __s2 = (char *)sqlite3ValueText(argv[1],'\x01');
      }
      if (__s2 == (char *)0x0) {
        return;
      }
      if (iVar5 != 0 && __s1 == (char *)0x0) {
        return;
      }
      if (iVar5 < (int)uVar6) {
        val = 0;
      }
      else {
        cVar1 = *__s2;
        uVar8 = 1;
        do {
          if ((*__s1 == cVar1) && (iVar7 = bcmp(__s1,__s2,(ulong)uVar6), iVar7 == 0))
          goto LAB_00195b3b;
          uVar8 = uVar8 + 1;
          __s1 = __s1 + 1;
          bVar4 = (int)uVar6 < iVar5;
          iVar5 = iVar5 + -1;
        } while (bVar4);
        uVar8 = 0;
LAB_00195b3b:
        val = (ulong)uVar8;
      }
    }
    pMem = context->pOut;
    if ((pMem->flags & 0x2400) != 0) {
      vdbeReleaseAndSetInt64(pMem,val);
      return;
    }
    (pMem->u).i = val;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;
  unsigned char firstChar;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else{
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) return;
    firstChar = zNeedle[0];
    while( nNeedle<=nHaystack
       && (zHaystack[0]!=firstChar || memcmp(zHaystack, zNeedle, nNeedle)!=0)
    ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
}